

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  ImVector<unsigned_int> *pIVar1;
  ImVector<ImGuiColumnData> *pIVar2;
  int *piVar3;
  ImRect *pIVar4;
  ImVec2 IVar5;
  ImGuiWindow *this;
  ImGuiColumnsSet *pIVar6;
  int iVar7;
  ImGuiContext *pIVar8;
  int iVar9;
  ImGuiID IVar10;
  int iVar11;
  long lVar12;
  ImGuiColumnsSet *pIVar13;
  ImGuiColumnData *pIVar14;
  ImGuiColumnData *pIVar15;
  int iVar16;
  int iVar17;
  ImGuiContext *g;
  char *str;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ImGuiColumnsSet local_70;
  
  pIVar8 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  iVar9 = columns_count + 0x11223347;
  if (str_id != (char *)0x0) {
    iVar9 = 0x11223347;
  }
  str = "columns";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  PushID(iVar9);
  IVar10 = ImGuiWindow::GetID(this,str,(char *)0x0);
  pIVar1 = &GImGui->CurrentWindow->IDStack;
  pIVar1->Size = pIVar1->Size + -1;
  lVar12 = (long)(this->ColumnsStorage).Size;
  if (0 < lVar12) {
    pIVar13 = (this->ColumnsStorage).Data;
    do {
      if (pIVar13->ID == IVar10) goto LAB_0012c329;
      pIVar13 = pIVar13 + 1;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  ImGuiColumnsSet::ImGuiColumnsSet(&local_70);
  iVar9 = (this->ColumnsStorage).Size;
  if (iVar9 == (this->ColumnsStorage).Capacity) {
    if (iVar9 == 0) {
      iVar16 = 8;
    }
    else {
      iVar16 = iVar9 / 2 + iVar9;
    }
    iVar17 = iVar9 + 1;
    if (iVar9 + 1 < iVar16) {
      iVar17 = iVar16;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar3 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar3 = *piVar3 + 1;
    }
    pIVar13 = (ImGuiColumnsSet *)(*GImAllocatorAllocFunc)((long)iVar17 << 6,GImAllocatorUserData);
    pIVar6 = (this->ColumnsStorage).Data;
    if (pIVar6 != (ImGuiColumnsSet *)0x0) {
      memcpy(pIVar13,pIVar6,(long)(this->ColumnsStorage).Size << 6);
      pIVar6 = (this->ColumnsStorage).Data;
      if ((pIVar6 != (ImGuiColumnsSet *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar3 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar3 = *piVar3 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
    }
    (this->ColumnsStorage).Data = pIVar13;
    (this->ColumnsStorage).Capacity = iVar17;
    iVar9 = (this->ColumnsStorage).Size;
  }
  else {
    pIVar13 = (this->ColumnsStorage).Data;
  }
  pIVar2 = &pIVar13[iVar9].Columns;
  pIVar2->Size = local_70.Columns.Size;
  pIVar2->Capacity = local_70.Columns.Capacity;
  *(undefined4 *)&pIVar2->Data = local_70.Columns.Data._0_4_;
  *(undefined4 *)((long)&pIVar2->Data + 4) = local_70.Columns.Data._4_4_;
  pIVar6 = pIVar13 + iVar9;
  pIVar6->LineMaxY = local_70.LineMaxY;
  pIVar6->StartPosY = local_70.StartPosY;
  *(undefined8 *)(&pIVar6->LineMaxY + 2) = local_70._40_8_;
  piVar3 = &pIVar13[iVar9].Count;
  *piVar3 = local_70.Count;
  piVar3[1] = (int)local_70.MinX;
  piVar3[2] = (int)local_70.MaxX;
  piVar3[3] = (int)local_70.LineMinY;
  pIVar13 = pIVar13 + iVar9;
  pIVar13->ID = local_70.ID;
  pIVar13->Flags = local_70.Flags;
  pIVar13->IsFirstFrame = local_70.IsFirstFrame;
  pIVar13->IsBeingResized = local_70.IsBeingResized;
  *(undefined2 *)&pIVar13->field_0xa = local_70._10_2_;
  pIVar13->Current = local_70.Current;
  iVar9 = (this->ColumnsStorage).Size + 1;
  (this->ColumnsStorage).Size = iVar9;
  if ((void *)CONCAT44(local_70.Columns.Data._4_4_,local_70.Columns.Data._0_4_) != (void *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar3 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar3 = *piVar3 + -1;
    }
    (*GImAllocatorFreeFunc)
              ((void *)CONCAT44(local_70.Columns.Data._4_4_,local_70.Columns.Data._0_4_),
               GImAllocatorUserData);
    iVar9 = (this->ColumnsStorage).Size;
  }
  pIVar13 = (this->ColumnsStorage).Data + (long)iVar9 + -1;
  pIVar13->ID = IVar10;
LAB_0012c329:
  pIVar13->Current = 0;
  pIVar13->Count = columns_count;
  pIVar13->Flags = flags;
  (this->DC).ColumnsSet = pIVar13;
  fVar20 = (this->SizeContentsExplicit).x;
  if ((fVar20 != 0.0) || (NAN(fVar20))) {
    fVar22 = (this->Pos).x;
  }
  else {
    fVar22 = (this->Pos).x;
    fVar20 = (this->InnerClipRect).Max.x - fVar22;
  }
  fVar23 = (this->DC).Indent.x;
  fVar21 = fVar23 - (pIVar8->Style).ItemSpacing.x;
  pIVar13->MinX = fVar21;
  fVar20 = fVar20 - (this->Scroll).x;
  fVar21 = fVar21 + 1.0;
  uVar18 = -(uint)(fVar21 <= fVar20);
  pIVar13->MaxX = (float)(~uVar18 & (uint)fVar21 | (uint)fVar20 & uVar18);
  fVar20 = (this->DC).CursorPos.y;
  pIVar13->StartPosY = fVar20;
  pIVar13->StartMaxPosX = (this->DC).CursorMaxPos.x;
  pIVar13->LineMaxY = fVar20;
  pIVar13->LineMinY = fVar20;
  (this->DC).ColumnsOffset.x = 0.0;
  (this->DC).CursorPos.x = (float)(int)(fVar22 + fVar23 + 0.0);
  iVar9 = (pIVar13->Columns).Size;
  iVar16 = columns_count + 1;
  if (iVar9 == iVar16 || iVar9 == 0) {
    pIVar13->IsFirstFrame = iVar9 == 0;
    if (iVar9 == 0) {
      iVar9 = (pIVar13->Columns).Capacity;
      goto LAB_0012c4c6;
    }
  }
  else {
    iVar9 = (pIVar13->Columns).Capacity;
    if (iVar9 < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar3 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar3 = *piVar3 + 1;
      }
      iVar9 = 0;
      pIVar14 = (ImGuiColumnData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      pIVar15 = (pIVar13->Columns).Data;
      if (pIVar15 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar14,pIVar15,(long)(pIVar13->Columns).Size * 0x1c);
        pIVar15 = (pIVar13->Columns).Data;
        if ((pIVar15 != (ImGuiColumnData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar3 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar3 = *piVar3 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar15,GImAllocatorUserData);
      }
      (pIVar13->Columns).Data = pIVar14;
      (pIVar13->Columns).Capacity = 0;
    }
    (pIVar13->Columns).Size = 0;
    pIVar13->IsFirstFrame = true;
LAB_0012c4c6:
    if (iVar9 <= columns_count) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar3 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar3 = *piVar3 + 1;
      }
      pIVar14 = (ImGuiColumnData *)
                (*GImAllocatorAllocFunc)((long)iVar16 * 0x1c,GImAllocatorUserData);
      pIVar15 = (pIVar13->Columns).Data;
      if (pIVar15 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar14,pIVar15,(long)(pIVar13->Columns).Size * 0x1c);
        pIVar15 = (pIVar13->Columns).Data;
        if ((pIVar15 != (ImGuiColumnData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar3 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar3 = *piVar3 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar15,GImAllocatorUserData);
      }
      (pIVar13->Columns).Data = pIVar14;
      (pIVar13->Columns).Capacity = iVar16;
    }
    if (columns_count < 0) goto LAB_0012c79e;
    iVar9 = (pIVar13->Columns).Size;
    iVar17 = 0;
    do {
      if (iVar9 == (pIVar13->Columns).Capacity) {
        if (iVar9 == 0) {
          iVar11 = 8;
        }
        else {
          iVar11 = iVar9 / 2 + iVar9;
        }
        iVar7 = iVar9 + 1;
        if (iVar9 + 1 < iVar11) {
          iVar7 = iVar11;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar3 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar3 = *piVar3 + 1;
        }
        pIVar15 = (ImGuiColumnData *)
                  (*GImAllocatorAllocFunc)((long)iVar7 * 0x1c,GImAllocatorUserData);
        pIVar14 = (pIVar13->Columns).Data;
        if (pIVar14 != (ImGuiColumnData *)0x0) {
          memcpy(pIVar15,pIVar14,(long)(pIVar13->Columns).Size * 0x1c);
          pIVar14 = (pIVar13->Columns).Data;
          if ((pIVar14 != (ImGuiColumnData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar3 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar3 = *piVar3 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar14,GImAllocatorUserData);
        }
        (pIVar13->Columns).Data = pIVar15;
        (pIVar13->Columns).Capacity = iVar7;
        iVar9 = (pIVar13->Columns).Size;
      }
      else {
        pIVar15 = (pIVar13->Columns).Data;
      }
      pIVar15[iVar9].OffsetNorm = (float)iVar17 / (float)columns_count;
      pIVar15[iVar9].OffsetNormBeforeResize = 0.0;
      pIVar15[iVar9].Flags = 0;
      pIVar4 = &pIVar15[iVar9].ClipRect;
      (pIVar4->Min).x = 3.4028235e+38;
      (pIVar4->Min).y = 3.4028235e+38;
      (pIVar4->Max).x = -3.4028235e+38;
      (pIVar4->Max).y = -3.4028235e+38;
      iVar9 = (pIVar13->Columns).Size + 1;
      (pIVar13->Columns).Size = iVar9;
      iVar17 = iVar17 + 1;
    } while (iVar16 != iVar17);
  }
  if (0 < columns_count) {
    lVar12 = 0;
    do {
      pIVar15 = (pIVar13->Columns).Data;
      fVar22 = (this->Pos).x + 0.5;
      pIVar6 = (GImGui->CurrentWindow->DC).ColumnsSet;
      pIVar14 = (pIVar6->Columns).Data;
      fVar20 = pIVar6->MinX;
      fVar23 = pIVar6->MaxX - fVar20;
      fVar21 = (float)(int)(*(float *)((long)&pIVar14->OffsetNorm + lVar12) * fVar23 + fVar20 +
                            fVar22 + -1.0);
      fVar20 = (float)(int)(fVar23 * *(float *)((long)&pIVar14[1].OffsetNorm + lVar12) + fVar20 +
                            fVar22 + -1.0);
      *(float *)((long)&(pIVar15->ClipRect).Min.x + lVar12) = fVar21;
      *(undefined4 *)((long)&(pIVar15->ClipRect).Min.y + lVar12) = 0xff7fffff;
      *(float *)((long)&(pIVar15->ClipRect).Max.x + lVar12) = fVar20;
      *(undefined4 *)((long)&(pIVar15->ClipRect).Max.y + lVar12) = 0x7f7fffff;
      IVar5 = (this->ClipRect).Min;
      fVar22 = IVar5.x;
      fVar23 = IVar5.y;
      uVar18 = -(uint)(fVar22 <= fVar21);
      uVar19 = -(uint)(fVar23 <= -3.4028235e+38);
      *(ulong *)((long)&(pIVar15->ClipRect).Min.x + lVar12) =
           CONCAT44(~uVar19 & (uint)fVar23,~uVar18 & (uint)fVar22) |
           CONCAT44(uVar19,(uint)fVar21 & uVar18) & 0xff7fffffffffffff;
      auVar24._4_4_ = 0x7f7fffff;
      auVar24._0_4_ = fVar20;
      auVar24._8_8_ = 0;
      auVar25._8_8_ = 0;
      auVar25._0_4_ = (this->ClipRect).Max.x;
      auVar25._4_4_ = (this->ClipRect).Max.y;
      auVar25 = minps(auVar24,auVar25);
      *(long *)((long)&(pIVar15->ClipRect).Max.x + lVar12) = auVar25._0_8_;
      lVar12 = lVar12 + 0x1c;
    } while ((ulong)(uint)columns_count * 0x1c != lVar12);
  }
LAB_0012c79e:
  ImDrawList::ChannelsSplit(this->DrawList,pIVar13->Count);
  pIVar13 = (GImGui->CurrentWindow->DC).ColumnsSet;
  iVar9 = pIVar13->Current;
  pIVar15 = (pIVar13->Columns).Data;
  PushClipRect(&pIVar15[iVar9].ClipRect.Min,&pIVar15[iVar9].ClipRect.Max,false);
  pIVar13 = (GImGui->CurrentWindow->DC).ColumnsSet;
  pIVar15 = (pIVar13->Columns).Data;
  PushItemWidth((pIVar13->MaxX - pIVar13->MinX) *
                (pIVar15[(long)pIVar13->Current + 1].OffsetNorm -
                pIVar15[pIVar13->Current].OffsetNorm) * 0.65);
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count > 1);
    IM_ASSERT(window->DC.ColumnsSet == NULL); // Nested columns are currently not supported

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (str_id ? 0 : columns_count));
    ImGuiID id = window->GetID(str_id ? str_id : "columns");
    PopID();

    // Acquire storage for the columns set
    ImGuiColumnsSet* columns = FindOrAddColumnsSet(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.ColumnsSet = columns;

    // Set state for first column
    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? (window->SizeContentsExplicit.x) : (window->InnerClipRect.Max.x - window->Pos.x);
    columns->MinX = window->DC.Indent.x - g.Style.ItemSpacing.x; // Lock our horizontal range
    columns->MaxX = ImMax(content_region_width - window->Scroll.x, columns->MinX + 1.0f);
    columns->StartPosY = window->DC.CursorPos.y;
    columns->StartMaxPosX = window->DC.CursorMaxPos.x;
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize defaults
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n) - 1.0f);
        float clip_x2 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    window->DrawList->ChannelsSplit(columns->Count);
    PushColumnClipRect();
    PushItemWidth(GetColumnWidth() * 0.65f);
}